

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

int __thiscall
fmt::v10::detail::count_digits_fallback<unsigned__int128>(detail *this,unsigned___int128 n)

{
  int iVar1;
  int iVar2;
  ulong in_RSI;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  auVar5._8_8_ = in_RSI;
  auVar5._0_8_ = this;
  iVar2 = 1;
  if ((this < (detail *)0xa) <= in_RSI) {
    iVar1 = 4;
    do {
      iVar2 = iVar1;
      uVar3 = auVar5._8_8_;
      uVar4 = auVar5._0_8_;
      if (uVar3 == 0 && (ulong)(99 < uVar4) <= -uVar3) {
        return iVar2 + -2;
      }
      if (uVar3 == 0 && (ulong)(999 < uVar4) <= -uVar3) {
        return iVar2 + -1;
      }
      if (uVar3 < (uVar4 < 10000)) {
        return iVar2;
      }
      auVar5 = __udivti3(uVar4,uVar3,10000,0);
      iVar1 = iVar2 + 4;
    } while (uVar3 != 0 || -uVar3 < (ulong)(99999 < uVar4));
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

FMT_CONSTEXPR auto count_digits_fallback(T n) -> int {
  int count = 1;
  for (;;) {
    // Integer division is slow so do it for a group of four digits instead
    // of for every digit. The idea comes from the talk by Alexandrescu
    // "Three Optimization Tips for C++". See speed-test for a comparison.
    if (n < 10) return count;
    if (n < 100) return count + 1;
    if (n < 1000) return count + 2;
    if (n < 10000) return count + 3;
    n /= 10000u;
    count += 4;
  }
}